

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::detail::convertTemperature<units::precise_unit,units::precise_unit>
                 (double val,precise_unit *start,precise_unit *result)

{
  bool bVar1;
  const_reference pvVar2;
  precise_unit *in_RSI;
  precise_unit *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  size_type in_stack_ffffffffffffff88;
  precise_unit *in_stack_ffffffffffffff90;
  precise_unit *in_stack_ffffffffffffff98;
  undefined8 local_10;
  undefined8 local_8;
  
  bVar1 = is_temperature(in_stack_ffffffffffffff90);
  if (bVar1) {
    unit_cast(in_stack_ffffffffffffff98);
    bVar1 = unit::operator==((unit *)in_stack_ffffffffffffff98,(unit *)in_stack_ffffffffffffff90);
    if (bVar1) {
      local_10 = ((in_XMM0_Qa - 32.0) * 5.0) / 9.0;
    }
    else {
      dVar3 = precise_unit::multiplier(in_RDI);
      if ((dVar3 != 1.0) || (local_10 = in_XMM0_Qa, NAN(dVar3))) {
        dVar3 = precise_unit::multiplier(in_RDI);
        if ((29.5 <= dVar3) || (dVar3 = precise_unit::multiplier(in_RDI), dVar3 < 0.0)) {
          local_10 = precise_unit::multiplier(in_RDI);
          local_10 = in_XMM0_Qa * local_10;
        }
        else {
          dVar3 = precise_unit::multiplier(in_RDI);
          precise_unit::multiplier(in_RDI);
          pvVar2 = std::array<double,_30UL>::operator[]
                             ((array<double,_30UL> *)in_stack_ffffffffffffff90,
                              in_stack_ffffffffffffff88);
          local_10 = in_XMM0_Qa * dVar3 + *pvVar2;
        }
      }
    }
    local_10 = local_10 + 273.15;
  }
  else {
    local_10 = precise_unit::multiplier(in_RDI);
    local_10 = in_XMM0_Qa * local_10;
  }
  bVar1 = is_temperature(in_stack_ffffffffffffff90);
  if (bVar1) {
    local_10 = local_10 - 273.15;
    unit_cast(in_stack_ffffffffffffff98);
    bVar1 = unit::operator==((unit *)in_stack_ffffffffffffff98,(unit *)in_stack_ffffffffffffff90);
    if (bVar1) {
      local_10 = local_10 * 1.8 + 32.0;
    }
    else {
      dVar3 = precise_unit::multiplier(in_RSI);
      if ((dVar3 != 1.0) || (NAN(dVar3))) {
        dVar3 = precise_unit::multiplier(in_RSI);
        if ((29.5 <= dVar3) || (dVar3 = precise_unit::multiplier(in_RSI), dVar3 < 0.0)) {
          dVar3 = precise_unit::multiplier(in_RSI);
          local_10 = local_10 / dVar3;
        }
        else {
          precise_unit::multiplier(in_RSI);
          pvVar2 = std::array<double,_30UL>::operator[]
                             ((array<double,_30UL> *)in_stack_ffffffffffffff90,
                              in_stack_ffffffffffffff88);
          dVar3 = *pvVar2;
          dVar4 = precise_unit::multiplier(in_RSI);
          local_10 = (local_10 - dVar3) / dVar4;
        }
      }
    }
    local_8 = local_10;
  }
  else {
    local_8 = precise_unit::multiplier(in_RSI);
    local_8 = local_10 / local_8;
  }
  return local_8;
}

Assistant:

double convertTemperature(double val, const UX& start, const UX2& result)
    {
        static constexpr std::array<double, 30> biasTable{
            0.0, 0.0, 0.0, 0.0, 0.0,   0.0,   0.0, 0.0,     0.0, 0.0,
            0.0, 0.0, 0.0, 0.0, 121.0, 0.0,   0.0, 0.0,     0.0, 0.0,
            0.0, 0.0, 0.0, 0.0, 0.0,   150.0, 0.0, 37.7778, 0.0, 0.0};

        if (is_temperature(start)) {
            if (units::degF == unit_cast(start)) {
                val = (val - 32.0) * 5.0 / 9.0;
            } else if (start.multiplier() != 1.0) {
                if (start.multiplier() < 29.5 && start.multiplier() >= 0.0) {
                    val = val * start.multiplier() +
                        biasTable[static_cast<int>(start.multiplier())];
                } else {
                    val = val * start.multiplier();
                }
            }
            val += 273.15;
            // convert to K
        } else {
            val = val * start.multiplier();
        }
        if (is_temperature(result)) {
            val -= 273.15;
            if (units::degF == unit_cast(result)) {
                val *= 9.0 / 5.0;
                val += 32.0;
            } else if (result.multiplier() != 1.0) {
                if (result.multiplier() < 29.5 && result.multiplier() >= 0.0) {
                    val = (val -
                           biasTable[static_cast<int>(result.multiplier())]) /
                        result.multiplier();
                } else {
                    val = val / result.multiplier();
                }
            }
            return val;
        }
        return val / result.multiplier();
    }